

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O0

int CgroupController::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  Config *this;
  path *__lhs;
  ContextManager *pCVar2;
  value_type *pvVar3;
  undefined8 uVar4;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  error_code error;
  path local_88;
  path local_60;
  undefined1 local_38 [8];
  path path;
  string *name_local;
  
  path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )ctx;
  this = Config::get();
  __lhs = Config::get_cgroup_root_abi_cxx11_(this);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             path._M_cmpts._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl,auto_format);
  std::filesystem::__cxx11::operator/(&local_60,__lhs,&local_88);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            ((path *)&error._M_cat,(char (*) [8])"libsbox",auto_format);
  std::filesystem::__cxx11::operator/((path *)local_38,&local_60,(path *)&error._M_cat);
  std::filesystem::__cxx11::path::~path((path *)&error._M_cat);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::error_code::error_code((error_code *)local_d0);
  std::filesystem::remove((path *)local_38,(error_code *)local_d0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_d0);
  if (bVar1) {
    pCVar2 = ContextManager::get();
    pvVar3 = std::filesystem::__cxx11::path::c_str((path *)local_38);
    std::error_code::message_abi_cxx11_(&local_110,(error_code *)local_d0);
    uVar4 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_f0,"Cannot remove dir \'%s\': %s",pvVar3,uVar4);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::filesystem::create_directories((path *)local_38,(error_code *)local_d0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_d0);
  if (bVar1) {
    pCVar2 = ContextManager::get();
    pvVar3 = std::filesystem::__cxx11::path::c_str((path *)local_38);
    std::error_code::message_abi_cxx11_(&local_150,(error_code *)local_d0);
    uVar4 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_130,"Cannot create dir \'%s\': %s",pvVar3,uVar4);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::filesystem::__cxx11::path::~path((path *)local_38);
  return extraout_EAX;
}

Assistant:

void CgroupController::init(const std::string &name) {
    fs::path path = Config::get().get_cgroup_root() / name / "libsbox";
    std::error_code error;
    fs::remove(path, error);
    if (error) {
        die(format("Cannot remove dir '%s': %s", path.c_str(), error.message().c_str()));
    }
    fs::create_directories(path, error);
    if (error) {
        die(format("Cannot create dir '%s': %s", path.c_str(), error.message().c_str()));
    }
}